

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScopedThread.hpp
# Opt level: O0

void __thiscall crsGA::ScopedThread::~ScopedThread(ScopedThread *this)

{
  bool bVar1;
  ScopedThread *this_local;
  
  bVar1 = std::thread::joinable(&this->_t);
  if (bVar1) {
    std::thread::join();
  }
  std::thread::~thread(&this->_t);
  return;
}

Assistant:

~ScopedThread()
    {
        if (_t.joinable())
            _t.join();
    }